

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

Result<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_> * __thiscall
wallet::anon_unknown_5::WalletLoaderImpl::restoreWallet
          (Result<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
           *__return_storage_ptr__,WalletLoaderImpl *this,path *backup_file,string *wallet_name,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  long lVar1;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sStack_b8;
  long local_a8;
  DatabaseStatus status;
  bilingual_str local_98;
  bilingual_str error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  RestoreWallet((wallet *)&sStack_b8,&this->m_context,backup_file,(string *)wallet_name,
                (optional<bool>)0x101,&status,&error,
                (vector<bilingual_str,_std::allocator<bilingual_str>_> *)warnings);
  interfaces::MakeWallet((interfaces *)&local_a8,&this->m_context,&sStack_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &sStack_b8.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  if (local_a8 == 0) {
    bilingual_str::bilingual_str(&local_98,&error);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>>
    ::_Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>>
                *)__return_storage_ptr__,&local_98);
    bilingual_str::~bilingual_str(&local_98);
  }
  else {
    *(long *)&(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
              .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> =
         local_a8;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
             .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
     0x40) = '\x01';
  }
  bilingual_str::~bilingual_str(&error);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<std::unique_ptr<Wallet>> restoreWallet(const fs::path& backup_file, const std::string& wallet_name, std::vector<bilingual_str>& warnings) override
    {
        DatabaseStatus status;
        bilingual_str error;
        std::unique_ptr<Wallet> wallet{MakeWallet(m_context, RestoreWallet(m_context, backup_file, wallet_name, /*load_on_start=*/true, status, error, warnings))};
        if (wallet) {
            return wallet;
        } else {
            return util::Error{error};
        }
    }